

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cc
# Opt level: O0

void __thiscall
pstack::Procman::Process::addElfObject(Process *this,string_view name,sptr *obj,Addr load)

{
  basic_string_view<char,_std::char_traits<char>_> __str;
  ostream *poVar1;
  basic_ostream<char,_std::char_traits<char>_> *pbVar2;
  void *pvVar3;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_long,_pstack::Procman::MappedObject>_>,_bool>
  pVar4;
  undefined1 local_1d8 [8];
  IOFlagSave _;
  MappedObject local_98;
  pair<unsigned_long,_pstack::Procman::MappedObject> local_68;
  Addr local_30;
  Addr load_local;
  sptr *obj_local;
  Process *this_local;
  string_view name_local;
  
  name_local._M_len = (size_t)name._M_str;
  this_local = (Process *)name._M_len;
  local_30 = load;
  load_local = (Addr)obj;
  obj_local = (sptr *)this;
  MappedObject::MappedObject(&local_98,name,obj);
  std::make_pair<unsigned_long&,pstack::Procman::MappedObject>(&local_68,&local_30,&local_98);
  pVar4 = std::
          map<unsigned_long,pstack::Procman::MappedObject,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,pstack::Procman::MappedObject>>>
          ::emplace<std::pair<unsigned_long,pstack::Procman::MappedObject>>
                    ((map<unsigned_long,pstack::Procman::MappedObject,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,pstack::Procman::MappedObject>>>
                      *)&this->objects,&local_68);
  _._264_8_ = pVar4.first._M_node;
  std::pair<unsigned_long,_pstack::Procman::MappedObject>::~pair(&local_68);
  MappedObject::~MappedObject(&local_98);
  if (1 < *(int *)(this->context + 0xa0)) {
    IOFlagSave::IOFlagSave
              ((IOFlagSave *)local_1d8,
               (ios *)((long)*(long **)(this->context + 0x78) +
                      *(long *)(**(long **)(this->context + 0x78) + -0x18)));
    poVar1 = std::operator<<(*(ostream **)(this->context + 0x78),"object ");
    __str._M_str = (char *)name_local._M_len;
    __str._M_len = (size_t)this_local;
    pbVar2 = std::operator<<(poVar1,__str);
    poVar1 = std::operator<<(pbVar2," loaded at address ");
    pvVar3 = (void *)std::ostream::operator<<(poVar1,std::hex);
    pvVar3 = (void *)std::ostream::operator<<(pvVar3,local_30);
    pvVar3 = (void *)std::ostream::operator<<(pvVar3,std::dec);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    IOFlagSave::~IOFlagSave((IOFlagSave *)local_1d8);
  }
  return;
}

Assistant:

void
Process::addElfObject(std::string_view name, const Elf::Object::sptr &obj, Elf::Addr load)
{
    objects.emplace(std::make_pair(load, MappedObject{ name, obj }));
    if (context.verbose >= 2) {
        IOFlagSave _(*context.debug);
        *context.debug << "object " << name << " loaded at address "
           << std::hex << load << std::dec << std::endl;
    }
}